

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void process_definitions(Context *ctx)

{
  RegisterType RVar1;
  int regnum_00;
  RegisterList *pRVar2;
  int iVar3;
  int lo;
  int regnum_1;
  int arraysize;
  VariableList *var;
  int regnum;
  RegisterType regtype;
  RegisterList *next;
  RegisterList *item;
  RegisterList *prev;
  RegisterList *uitem;
  Context *ctx_local;
  
  determine_constants_arrays(ctx);
  prev = &ctx->uniforms;
  item = &ctx->used_registers;
  next = (ctx->used_registers).next;
  do {
    if (next == (RegisterList *)0x0) {
      for (_regnum_1 = ctx->variables; _regnum_1 != (VariableList *)0x0; _regnum_1 = _regnum_1->next
          ) {
        if (_regnum_1->used != 0) {
          if (_regnum_1->constant == (ConstantsList *)0x0) {
            (*ctx->profile->array_emitter)(ctx,_regnum_1);
            ctx->uniform_float4_count = _regnum_1->count + ctx->uniform_float4_count;
          }
          else {
            (*ctx->profile->const_array_emitter)
                      (ctx,_regnum_1->constant,_regnum_1->index,_regnum_1->count);
          }
          ctx->uniform_count = ctx->uniform_count + 1;
        }
      }
      next = (ctx->uniforms).next;
      do {
        if (next == (RegisterList *)0x0) {
          for (next = (ctx->samplers).next; next != (RegisterList *)0x0; next = next->next) {
            ctx->sampler_count = ctx->sampler_count + 1;
            (*ctx->profile->sampler_emitter)(ctx,next->regnum,next->index,SUB14(next->misc != 0,0));
          }
          for (next = (ctx->attributes).next; next != (RegisterList *)0x0; next = next->next) {
            ctx->attribute_count = ctx->attribute_count + 1;
            (*ctx->profile->attribute_emitter)
                      (ctx,next->regtype,next->regnum,next->usage,next->index,next->writemask,
                       next->misc);
          }
          return;
        }
        lo = -1;
        if (next->regtype == REG_TYPE_CONST) {
          for (_regnum_1 = ctx->variables; _regnum_1 != (VariableList *)0x0;
              _regnum_1 = _regnum_1->next) {
            if (_regnum_1->used != 0) {
              if ((_regnum_1->index <= next->regnum) &&
                 (next->regnum < _regnum_1->index + _regnum_1->count)) {
                if (_regnum_1->constant != (ConstantsList *)0x0) {
                  __assert_fail("!var->constant",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                                ,0x2e65,"void process_definitions(Context *)");
                }
                next->array = _regnum_1;
                lo = _regnum_1->count;
                break;
              }
            }
          }
        }
        (*ctx->profile->uniform_emitter)(ctx,next->regtype,next->regnum,_regnum_1);
        if (lo < 0) {
          ctx->uniform_count = ctx->uniform_count + 1;
          RVar1 = next->regtype;
          if (RVar1 == REG_TYPE_CONST) {
            ctx->uniform_float4_count = ctx->uniform_float4_count + 1;
          }
          else if (RVar1 == REG_TYPE_CONSTINT) {
            ctx->uniform_int4_count = ctx->uniform_int4_count + 1;
          }
          else if (RVar1 == REG_TYPE_CONSTBOOL) {
            ctx->uniform_bool_count = ctx->uniform_bool_count + 1;
          }
        }
        next = next->next;
      } while( true );
    }
    pRVar2 = next->next;
    RVar1 = next->regtype;
    regnum_00 = next->regnum;
    iVar3 = get_defined_register(ctx,RVar1,regnum_00);
    if (iVar3 == 0) {
      switch(RVar1) {
      case REG_TYPE_TEMP:
      case REG_TYPE_ADDRESS:
      case REG_TYPE_LOOP:
      case REG_TYPE_LABEL:
      case REG_TYPE_MAX:
        (*ctx->profile->global_emitter)(ctx,RVar1,regnum_00);
        break;
      case REG_TYPE_INPUT:
        iVar3 = shader_is_pixel(ctx);
        if ((iVar3 == 0) || (iVar3 = shader_version_atleast(ctx,'\x02','\0'), iVar3 != 0))
        goto switchD_00109a32_caseD_a;
        add_attribute_register(ctx,RVar1,regnum_00,MOJOSHADER_USAGE_COLOR,regnum_00,0xf,0);
        break;
      case REG_TYPE_CONST:
      case REG_TYPE_CONSTINT:
      case REG_TYPE_CONSTBOOL:
        item->next = pRVar2;
        next->next = (RegisterList *)0x0;
        prev->next = next;
        prev = next;
        next = item;
        break;
      case REG_TYPE_RASTOUT:
      case REG_TYPE_ATTROUT:
      case REG_TYPE_OUTPUT:
      case REG_TYPE_COLOROUT:
      case REG_TYPE_DEPTHOUT:
        iVar3 = shader_is_vertex(ctx);
        if ((iVar3 != 0) && (iVar3 = shader_version_atleast(ctx,'\x03','\0'), iVar3 != 0)) {
          fail(ctx,"vs_3 can\'t use output registers without declaring them first.");
          return;
        }
        add_attribute_register(ctx,RVar1,regnum_00,MOJOSHADER_USAGE_UNKNOWN,0,0xf,0);
        break;
      default:
switchD_00109a32_caseD_a:
        fail(ctx,"BUG: we used a register we don\'t know how to define.");
      }
    }
    item = next;
    next = pRVar2;
  } while( true );
}

Assistant:

static void process_definitions(Context *ctx)
{
    // !!! FIXME: apparently, pre ps_3_0, sampler registers don't need to be
    // !!! FIXME:  DCL'd before use (default to 2d?). We aren't checking
    // !!! FIXME:  this at the moment, though.

    determine_constants_arrays(ctx);  // in case this hasn't been called yet.

    RegisterList *uitem = &ctx->uniforms;
    RegisterList *prev = &ctx->used_registers;
    RegisterList *item = prev->next;

    while (item != NULL)
    {
        RegisterList *next = item->next;
        const RegisterType regtype = item->regtype;
        const int regnum = item->regnum;

        if (!get_defined_register(ctx, regtype, regnum))
        {
            // haven't already dealt with this one.
            switch (regtype)
            {
                // !!! FIXME: I'm not entirely sure this is right...
                case REG_TYPE_RASTOUT:
                case REG_TYPE_ATTROUT:
                case REG_TYPE_TEXCRDOUT:
                case REG_TYPE_COLOROUT:
                case REG_TYPE_DEPTHOUT:
                    if (shader_is_vertex(ctx)&&shader_version_atleast(ctx,3,0))
                    {
                        fail(ctx, "vs_3 can't use output registers"
                                  " without declaring them first.");
                        return;
                    } // if

                    // Apparently this is an attribute that wasn't DCL'd.
                    //  Add it to the attribute list; deal with it later.
                    // !!! FIXME: we should use something other than UNKNOWN here.
                    add_attribute_register(ctx, regtype, regnum,
                                           MOJOSHADER_USAGE_UNKNOWN, 0, 0xF, 0);
                    break;

                case REG_TYPE_ADDRESS:
                case REG_TYPE_PREDICATE:
                case REG_TYPE_TEMP:
                case REG_TYPE_LOOP:
                case REG_TYPE_LABEL:
                    ctx->profile->global_emitter(ctx, regtype, regnum);
                    break;

                case REG_TYPE_CONST:
                case REG_TYPE_CONSTINT:
                case REG_TYPE_CONSTBOOL:
                    // separate uniforms into a different list for now.
                    prev->next = next;
                    item->next = NULL;
                    uitem->next = item;
                    uitem = item;
                    item = prev;
                    break;

                case REG_TYPE_INPUT:
                    // You don't have to dcl_ your inputs in Shader Model 1.
                    if (shader_is_pixel(ctx)&&!shader_version_atleast(ctx,2,0))
                    {
                        add_attribute_register(ctx, regtype, regnum,
                                               MOJOSHADER_USAGE_COLOR, regnum,
                                               0xF, 0);
                        break;
                    } // if
                    // fall through...

                default:
                    fail(ctx, "BUG: we used a register we don't know how to define.");
            } // switch
        } // if

        prev = item;
        item = next;
    } // while

    // okay, now deal with uniform/constant arrays...
    VariableList *var;
    for (var = ctx->variables; var != NULL; var = var->next)
    {
        if (var->used)
        {
            if (var->constant)
            {
                ctx->profile->const_array_emitter(ctx, var->constant,
                                                  var->index, var->count);
            } // if
            else
            {
                ctx->profile->array_emitter(ctx, var);
                ctx->uniform_float4_count += var->count;
            } // else
            ctx->uniform_count++;
        } // if
    } // for

    // ...and uniforms...
    for (item = ctx->uniforms.next; item != NULL; item = item->next)
    {
        int arraysize = -1;

        // check if this is a register contained in an array...
        if (item->regtype == REG_TYPE_CONST)
        {
            for (var = ctx->variables; var != NULL; var = var->next)
            {
                if (!var->used)
                    continue;

                const int regnum = item->regnum;
                const int lo = var->index;
                if ( (regnum >= lo) && (regnum < (lo + var->count)) )
                {
                    assert(!var->constant);
                    item->array = var;  // used when building parseData.
                    arraysize = var->count;
                    break;
                } // if
            } // for
        } // if

        ctx->profile->uniform_emitter(ctx, item->regtype, item->regnum, var);

        if (arraysize < 0)  // not part of an array?
        {
            ctx->uniform_count++;
            switch (item->regtype)
            {
                case REG_TYPE_CONST: ctx->uniform_float4_count++; break;
                case REG_TYPE_CONSTINT: ctx->uniform_int4_count++; break;
                case REG_TYPE_CONSTBOOL: ctx->uniform_bool_count++; break;
                default: break;
            } // switch
        } // if
    } // for

    // ...and samplers...
    for (item = ctx->samplers.next; item != NULL; item = item->next)
    {
        ctx->sampler_count++;
        ctx->profile->sampler_emitter(ctx, item->regnum,
                                      (TextureType) item->index,
                                      item->misc != 0);
    } // for

    // ...and attributes...
    for (item = ctx->attributes.next; item != NULL; item = item->next)
    {
        ctx->attribute_count++;
        ctx->profile->attribute_emitter(ctx, item->regtype, item->regnum,
                                        item->usage, item->index,
                                        item->writemask, item->misc);
    } // for
}